

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

uint __thiscall QXmlStreamReaderPrivate::getChar_helper(QXmlStreamReaderPrivate *this)

{
  QString *this_00;
  QByteArray *other;
  QStringDecoder *this_01;
  QIODevice *this_02;
  size_t __nbytes;
  qsizetype qVar1;
  Interface *pIVar2;
  char16_t *pcVar3;
  char *pcVar4;
  ssize_t sVar5;
  _Optional_payload_base<QStringConverter::Encoding> _Var6;
  Encoding *pEVar7;
  uint uVar8;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView data;
  _Optional_payload_base<QStringConverter::Encoding> local_90;
  qint64 local_88;
  char *local_80;
  undefined1 local_78 [8];
  char16_t *pcStack_70;
  qsizetype qStack_68;
  qsizetype local_60;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_58;
  ClearDataFn p_Stack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->characterOffset = this->characterOffset + this->readBufferPos;
  this->readBufferPos = 0;
  this_00 = &this->readBuffer;
  if ((this->readBuffer).d.size != 0) {
    QString::resize(this_00,0);
  }
  if ((this->decoder).super_QStringConverter.iface != (Interface *)0x0) {
    this->nbytesread = 0;
  }
  if (this->device == (QIODevice *)0x0) {
    other = &this->dataBuffer;
    if (this->nbytesread == 0) {
      QByteArray::operator=(&this->rawReadBuffer,other);
    }
    else {
      QByteArray::append(&this->rawReadBuffer,other);
    }
    this->nbytesread = (this->rawReadBuffer).d.size;
    QByteArray::clear(other);
    lVar9 = this->nbytesread;
  }
  else {
    QByteArray::resize(&this->rawReadBuffer,0x2000);
    this_02 = this->device;
    pcVar4 = QByteArray::data(&this->rawReadBuffer);
    __nbytes = this->nbytesread;
    sVar5 = QIODevice::read(this_02,(int)pcVar4 + (int)__nbytes,(void *)(0x2000 - __nbytes),__nbytes
                           );
    lVar9 = 0;
    if (0 < sVar5) {
      lVar9 = sVar5;
    }
    lVar9 = lVar9 + this->nbytesread;
    this->nbytesread = lVar9;
  }
  if (lVar9 != 0) {
    this_01 = &this->decoder;
    if ((this_01->super_QStringConverter).iface == (Interface *)0x0) {
      if (lVar9 < 4) goto LAB_0035562f;
      data.m_data = (storage_type *)0x3c;
      data.m_size = (qsizetype)(this->rawReadBuffer).d.ptr;
      _Var6 = (_Optional_payload_base<QStringConverter::Encoding>)
              QStringConverter::encodingForData
                        ((QStringConverter *)(this->rawReadBuffer).d.size,data,(char16_t)lVar9);
      local_90._M_payload = (_Storage<QStringConverter::Encoding,_true>)0x0;
      local_90._M_engaged = true;
      local_90._5_3_ = 0;
      if (((ulong)_Var6 >> 0x20 & 1) != 0) {
        local_90 = _Var6;
      }
      pEVar7 = std::
               _Optional_base_impl<QStringConverter::Encoding,_std::_Optional_base<QStringConverter::Encoding,_true,_true>_>
               ::_M_get((_Optional_base_impl<QStringConverter::Encoding,_std::_Optional_base<QStringConverter::Encoding,_true,_true>_>
                         *)&local_90);
      local_78 = (undefined1  [8])(QStringConverter::encodingInterfaces + *pEVar7);
      pcStack_70 = (char16_t *)0x0;
      qStack_68 = 0;
      local_60 = 0;
      aStack_58.d[0] = (void *)0x0;
      aStack_58.d[1] = (void *)0x0;
      p_Stack_48 = (ClearDataFn)0x0;
      QStringConverter::operator=(&this_01->super_QStringConverter,(QStringConverter *)local_78);
      QStringConverterBase::State::clear((State *)&pcStack_70);
    }
    local_80 = (this->rawReadBuffer).d.ptr;
    local_88 = this->nbytesread;
    local_90 = (_Optional_payload_base<QStringConverter::Encoding>)this_01;
    QStringDecoder::EncodedData::operator_cast_to_QString
              ((QString *)local_78,(EncodedData *)&local_90);
    pIVar2 = (Interface *)(this->readBuffer).d.d;
    pcVar3 = (this->readBuffer).d.ptr;
    (this->readBuffer).d.d = (Data *)local_78;
    (this->readBuffer).d.ptr = pcStack_70;
    qVar1 = (this->readBuffer).d.size;
    (this->readBuffer).d.size = qStack_68;
    local_78 = (undefined1  [8])pIVar2;
    pcStack_70 = pcVar3;
    qStack_68 = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    if (((this->field_0x3a9 & 8) != 0) &&
       ((this->decoder).super_QStringConverter.state.invalidChars != 0)) {
      uVar8 = 0xffffffff;
      QXmlStream::tr((QString *)local_78,"Encountered incorrectly encoded content.",(char *)0x0,-1);
      raiseWellFormedError(this,(QString *)local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      QString::clear(this_00);
      goto LAB_00355639;
    }
    QString::reserve(this_00,1);
    lVar9 = this->readBufferPos;
    if (lVar9 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar9 + 1;
      uVar8 = (uint)(ushort)(this->readBuffer).d.ptr[lVar9];
      goto LAB_00355639;
    }
  }
LAB_0035562f:
  this->atEnd = true;
  uVar8 = 0xffffffff;
LAB_00355639:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

uint QXmlStreamReaderPrivate::getChar_helper()
{
    constexpr qsizetype BUFFER_SIZE = 8192;
    characterOffset += readBufferPos;
    readBufferPos = 0;
    if (readBuffer.size())
        readBuffer.resize(0);
    if (decoder.isValid())
        nbytesread = 0;
    if (device) {
        rawReadBuffer.resize(BUFFER_SIZE);
        qint64 nbytesreadOrMinus1 = device->read(rawReadBuffer.data() + nbytesread, BUFFER_SIZE - nbytesread);
        nbytesread += qMax(nbytesreadOrMinus1, qint64{0});
    } else {
        if (nbytesread)
            rawReadBuffer += dataBuffer;
        else
            rawReadBuffer = dataBuffer;
        nbytesread = rawReadBuffer.size();
        dataBuffer.clear();
    }
    if (!nbytesread) {
        atEnd = true;
        return StreamEOF;
    }

    if (!decoder.isValid()) {
        if (nbytesread < 4) { // the 4 is to cover 0xef 0xbb 0xbf plus
                              // one extra for the utf8 codec
            atEnd = true;
            return StreamEOF;
        }
        auto encoding = QStringDecoder::encodingForData(rawReadBuffer, char16_t('<'));
        if (!encoding)
            // assume utf-8
            encoding = QStringDecoder::Utf8;
        decoder = QStringDecoder(*encoding);
    }

    readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));

    if (lockEncoding && decoder.hasError()) {
        raiseWellFormedError(QXmlStream::tr("Encountered incorrectly encoded content."));
        readBuffer.clear();
        return StreamEOF;
    }

    readBuffer.reserve(1); // keep capacity when calling resize() next time

    if (readBufferPos < readBuffer.size()) {
        ushort c = readBuffer.at(readBufferPos++).unicode();
        return c;
    }

    atEnd = true;
    return StreamEOF;
}